

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

S1Angle __thiscall S2Builder::SnapFunction::max_edge_deviation(SnapFunction *this)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  S2LogMessage SStack_18;
  
  (*this->_vptr_SnapFunction[2])();
  if (extraout_XMM0_Qa <= 1.2217304763960306) {
    (*this->_vptr_SnapFunction[2])(this);
    return (S1Angle)(extraout_XMM0_Qa_00 * 1.1);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x85,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (snap_radius()) <= (kMaxSnapRadius()) ",0x34);
  abort();
}

Assistant:

S1Angle S2Builder::SnapFunction::max_edge_deviation() const {
  // We want max_edge_deviation() to be large enough compared to snap_radius()
  // such that edge splitting is rare.
  //
  // Using spherical trigonometry, if the endpoints of an edge of length L
  // move by at most a distance R, the center of the edge moves by at most
  // asin(sin(R) / cos(L / 2)).  Thus the (max_edge_deviation / snap_radius)
  // ratio increases with both the snap radius R and the edge length L.
  //
  // We arbitrarily limit the edge deviation to be at most 10% more than the
  // snap radius.  With the maximum allowed snap radius of 70 degrees, this
  // means that edges up to 30.6 degrees long are never split.  For smaller
  // snap radii, edges up to 49 degrees long are never split.  (Edges of any
  // length are not split unless their endpoints move far enough so that the
  // actual edge deviation exceeds the limit; in practice, splitting is rare
  // even with long edges.)  Note that it is always possible to split edges
  // when max_edge_deviation() is exceeded; see MaybeAddExtraSites().
  S2_DCHECK_LE(snap_radius(), kMaxSnapRadius());
  const double kMaxEdgeDeviationRatio = 1.1;
  return kMaxEdgeDeviationRatio * snap_radius();
}